

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  NODE_STATE state_;
  int y_00;
  int x_00;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  Image pCVar7;
  rep rVar8;
  GridNode *this;
  GridNode *nodes_;
  ulong uVar9;
  GridNode *local_f0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_c8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c0;
  time_point stop;
  Path path;
  time_point start;
  Image img;
  int imgColumns;
  int imgRows;
  Grid grid;
  int local_2c;
  int local_28;
  int x;
  int y;
  GridNode *nodes;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Setup Grid Elements");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  uVar4 = (ulong)(rows * columns);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(0x48),0);
  uVar9 = uVar5 + 8;
  if (SUB168(auVar1 * ZEXT816(0x48),8) != 0 || 0xfffffffffffffff7 < uVar5) {
    uVar9 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar9);
  *puVar6 = uVar4;
  nodes_ = (GridNode *)(puVar6 + 1);
  if (uVar4 != 0) {
    local_f0 = nodes_;
    do {
      GridNode::GridNode(local_f0,0,0,EMPTY);
      local_f0 = local_f0 + 1;
    } while (local_f0 != nodes_ + uVar4);
  }
  for (local_28 = 0; local_28 < rows; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < columns; local_2c = local_2c + 1) {
      state_ = get_state_from_int(gridState[local_28 * columns + local_2c]);
      GridNode::GridNode((GridNode *)&grid.nodes,local_2c,local_28,state_);
      GridNode::operator=(nodes_ + (local_28 * columns + local_2c),(GridNode *)&grid.nodes);
      GridNode::~GridNode((GridNode *)&grid.nodes);
    }
  }
  Grid::Grid((Grid *)&imgColumns,rows,columns,nodes_);
  Grid::setup_neighbours((Grid *)&imgColumns);
  poVar3 = std::operator<<((ostream *)&std::cout,"Setting up Image");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  y_00 = rows * size;
  x_00 = columns * size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(y_00 * x_00);
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  operator_new__(uVar4);
  pCVar7 = get_image_from_grid((Grid *)&imgColumns);
  stbi_write_png("1.path_to_find.png",x_00,y_00,4,pCVar7,x_00 * 4);
  path.grids._8_8_ = std::chrono::_V2::system_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,"Finding path....");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  find_path((Path *)&stop,(Grid *)&imgColumns);
  Path::set_path((Path *)&stop);
  local_c0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_d0.__r = (rep)std::chrono::operator-
                                (&local_c0,
                                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&path.grids.count);
  local_c8.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_d0);
  rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_c8);
  printf("Pathfinding time is:- %5f\n",rVar8);
  poVar3 = std::operator<<((ostream *)&std::cout,"Showing Result");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pCVar7 = get_image_from_grid((Grid *)&imgColumns);
  stbi_write_png("2.final_path.png",x_00,y_00,4,pCVar7,x_00 * 4);
  if (nodes_ != (GridNode *)0x0) {
    this = nodes_ + *puVar6;
    while (nodes_ != this) {
      this = this + -1;
      GridNode::~GridNode(this);
    }
    operator_delete__(puVar6);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Finish!!!");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
    // Setup Grid
    std::cout << "Setup Grid Elements" << std::endl;
    GridNode *nodes = new GridNode[rows * columns];
    for (int y = 0; y < rows; y++)
    {
        for (int x = 0; x < columns; x++)
        {
            nodes[y * columns + x] = GridNode(x, y, get_state_from_int(gridState[y * columns + x]));
        }
    }
    Grid grid(rows, columns, nodes);
    grid.setup_neighbours();

    // Get Image
    std::cout << "Setting up Image" << std::endl;
    int imgRows = rows * size;
    int imgColumns = columns * size;
    Image img = new Colori[imgRows * imgColumns];
    img = get_image_from_grid(&grid);
    stbi_write_png("1.path_to_find.png", imgColumns, imgRows, 4, (void *)img, imgColumns * sizeof(Colori));

    // Process Pathfinding
    auto start = std::chrono::high_resolution_clock::now();
    std::cout << "Finding path...." << std::endl;
    Path path = find_path(&grid);
    path.set_path();
    auto stop = std::chrono::high_resolution_clock::now();
    printf("Pathfinding time is:- %5f\n", std::chrono::duration_cast<std::chrono::nanoseconds>(stop - start).count());

    // Show final Result
    std::cout << "Showing Result" << std::endl;
    img = get_image_from_grid(&grid);

    stbi_write_png("2.final_path.png", imgColumns, imgRows, 4, (void *)img, imgColumns * sizeof(Colori));

    // Finish Program
    delete[] nodes;
    std::cout << "Finish!!!" << std::endl;
}